

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_spawns.cxx
# Opt level: O0

void __thiscall xray_re::xr_scene_spawns::load(xr_scene_spawns *this,xr_reader *r)

{
  unsigned_short local_1a;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_scene_spawns *this_local;
  
  local_1a = 0;
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  xr_reader::r_chunk<unsigned_short>(r,0x1001,&local_1a);
  if (local_1a == 0) {
    xr_scene_objects::load(&this->super_xr_scene_objects,pxStack_18);
    xr_reader::r_chunk<unsigned_int>(pxStack_18,0x1002,&this->m_flags);
    return;
  }
  __assert_fail("version == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                ,0xdb,"virtual void xray_re::xr_scene_spawns::load(xr_reader &)");
}

Assistant:

void xr_scene_spawns::load(xr_reader& r)
{
	uint16_t version = 0;
	r.r_chunk<uint16_t>(TOOLS_CHUNK_VERSION, version);
	xr_assert(version == 0);
	xr_scene_objects::load(r);
	r.r_chunk<uint32_t>(SPAWNS_CHUNK_COMMON_FLAGS, m_flags);
}